

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::dataFloat(Forth *this,FCell x)

{
  FCell local_20;
  
  local_20 = x;
  checkValidHere(this,"F,");
  requireDataSpaceAvailable(this,(long)this->FCellSize,"F,");
  setDataCell(this,this->dataPointer,&local_20);
  this->dataPointer = this->dataPointer + this->FCellSize;
  return;
}

Assistant:

void dataFloat(FCell x) {
			REQUIRE_VALID_HERE("F,");
			REQUIRE_DATASPACE_AVAILABLE(FCellSize, "F,");
			REQUIRE_ALIGNED(getDataPointer(), "F,");
			setDataCell((AADDR(getDataPointer())), x);
			incDataPointer(FCellSize);
		}